

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sparsehashtable.h
# Opt level: O1

bool __thiscall
google::
sparse_hashtable<std::pair<const_A,_int>,_A,_HashA,_google::sparse_hash_map<A,_int,_HashA,_std::equal_to<A>,_google::libc_allocator_with_realloc<std::pair<const_A,_int>_>_>::SelectKey,_google::sparse_hash_map<A,_int,_HashA,_std::equal_to<A>,_google::libc_allocator_with_realloc<std::pair<const_A,_int>_>_>::SetKey,_std::equal_to<A>,_google::libc_allocator_with_realloc<std::pair<const_A,_int>_>_>
::resize_delta(sparse_hashtable<std::pair<const_A,_int>,_A,_HashA,_google::sparse_hash_map<A,_int,_HashA,_std::equal_to<A>,_google::libc_allocator_with_realloc<std::pair<const_A,_int>_>_>::SelectKey,_google::sparse_hash_map<A,_int,_HashA,_std::equal_to<A>,_google::libc_allocator_with_realloc<std::pair<const_A,_int>_>_>::SetKey,_std::equal_to<A>,_google::libc_allocator_with_realloc<std::pair<const_A,_int>_>_>
               *this,size_type delta)

{
  size_type sVar1;
  bool bVar2;
  size_type sVar3;
  size_type min_buckets_wanted;
  length_error *this_00;
  ulong uVar4;
  float fVar5;
  sparse_hashtable<std::pair<const_A,_int>,_A,_HashA,_google::sparse_hash_map<A,_int,_HashA,_std::equal_to<A>,_google::libc_allocator_with_realloc<std::pair<const_A,_int>_>_>::SelectKey,_google::sparse_hash_map<A,_int,_HashA,_std::equal_to<A>,_google::libc_allocator_with_realloc<std::pair<const_A,_int>_>_>::SetKey,_std::equal_to<A>,_google::libc_allocator_with_realloc<std::pair<const_A,_int>_>_>
  tmp;
  sparse_hashtable<std::pair<const_A,_int>,_A,_HashA,_google::sparse_hash_map<A,_int,_HashA,_std::equal_to<A>,_google::libc_allocator_with_realloc<std::pair<const_A,_int>_>_>::SelectKey,_google::sparse_hash_map<A,_int,_HashA,_std::equal_to<A>,_google::libc_allocator_with_realloc<std::pair<const_A,_int>_>_>::SetKey,_std::equal_to<A>,_google::libc_allocator_with_realloc<std::pair<const_A,_int>_>_>
  sStack_78;
  
  if ((this->settings).super_sh_hashtable_settings<A,_HashA,_unsigned_long,_4>.consider_shrink_ ==
      true) {
    bVar2 = maybe_shrink(this);
  }
  else {
    bVar2 = false;
  }
  uVar4 = (this->table).settings.num_buckets;
  if (uVar4 < ~delta) {
    if (((this->table).settings.table_size < 4) ||
       ((this->settings).super_sh_hashtable_settings<A,_HashA,_unsigned_long,_4>.enlarge_threshold_
        < uVar4 + delta)) {
      sVar3 = sparsehash_internal::sh_hashtable_settings<A,_HashA,_unsigned_long,_4>::min_buckets
                        ((sh_hashtable_settings<A,_HashA,_unsigned_long,_4> *)this,uVar4 + delta,0);
      uVar4 = (this->table).settings.table_size;
      if (uVar4 < sVar3) {
        min_buckets_wanted =
             sparsehash_internal::sh_hashtable_settings<A,_HashA,_unsigned_long,_4>::min_buckets
                       ((sh_hashtable_settings<A,_HashA,_unsigned_long,_4> *)this,
                        ((this->table).settings.num_buckets + delta) - this->num_deleted,uVar4);
        if (min_buckets_wanted < 0x7fffffffffffffff && min_buckets_wanted < sVar3) {
          sVar1 = min_buckets_wanted * 2;
          if ((long)sVar1 < 0) {
            fVar5 = (float)(min_buckets_wanted & 0x7fffffffffffffff) +
                    (float)(min_buckets_wanted & 0x7fffffffffffffff);
          }
          else {
            fVar5 = (float)(long)sVar1;
          }
          fVar5 = fVar5 * (this->settings).super_sh_hashtable_settings<A,_HashA,_unsigned_long,_4>.
                          shrink_factor_;
          uVar4 = (ulong)fVar5;
          if (((long)(fVar5 - 9.223372e+18) & (long)uVar4 >> 0x3f | uVar4) <=
              (delta + (this->table).settings.num_buckets) - this->num_deleted) {
            min_buckets_wanted = sVar1;
          }
        }
        sparse_hashtable(&sStack_78,MoveDontCopy,this,min_buckets_wanted);
        swap(this,&sStack_78);
        std::
        vector<google::sparsegroup<std::pair<const_A,_int>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<const_A,_int>_>_>,_google::libc_allocator_with_realloc<google::sparsegroup<std::pair<const_A,_int>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<const_A,_int>_>_>_>_>
        ::~vector(&sStack_78.table.groups);
        bVar2 = true;
      }
    }
    return bVar2;
  }
  this_00 = (length_error *)__cxa_allocate_exception(0x10);
  std::length_error::length_error(this_00,"resize overflow");
  __cxa_throw(this_00,&std::length_error::typeinfo,std::length_error::~length_error);
}

Assistant:

bool resize_delta(size_type delta) {
    bool did_resize = false;
    if (settings.consider_shrink()) {  // see if lots of deletes happened
      if (maybe_shrink()) did_resize = true;
    }
    if (table.num_nonempty() >=
        (std::numeric_limits<size_type>::max)() - delta) {
      throw std::length_error("resize overflow");
    }
    if (bucket_count() >= HT_MIN_BUCKETS &&
        (table.num_nonempty() + delta) <= settings.enlarge_threshold())
      return did_resize;  // we're ok as we are

    // Sometimes, we need to resize just to get rid of all the
    // "deleted" buckets that are clogging up the hashtable.  So when
    // deciding whether to resize, count the deleted buckets (which
    // are currently taking up room).  But later, when we decide what
    // size to resize to, *don't* count deleted buckets, since they
    // get discarded during the resize.
    const size_type needed_size =
        settings.min_buckets(table.num_nonempty() + delta, 0);
    if (needed_size <= bucket_count())  // we have enough buckets
      return did_resize;

    size_type resize_to = settings.min_buckets(
        table.num_nonempty() - num_deleted + delta, bucket_count());
    if (resize_to < needed_size &&  // may double resize_to
        resize_to < (std::numeric_limits<size_type>::max)() / 2) {
      // This situation means that we have enough deleted elements,
      // that once we purge them, we won't actually have needed to
      // grow.  But we may want to grow anyway: if we just purge one
      // element, say, we'll have to grow anyway next time we
      // insert.  Might as well grow now, since we're already going
      // through the trouble of copying (in order to purge the
      // deleted elements).
      const size_type target =
          static_cast<size_type>(settings.shrink_size(resize_to * 2));
      if (table.num_nonempty() - num_deleted + delta >= target) {
        // Good, we won't be below the shrink threshhold even if we
        // double.
        resize_to *= 2;
      }
    }

    sparse_hashtable tmp(MoveDontCopy, *this, resize_to);
    swap(tmp);  // now we are tmp
    return true;
  }